

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

void IDAProcessError(IDAMem IDA_mem,int error_code,int line,char *func,char *file,char *msgfmt,...)

{
  SUNContext pSVar1;
  char in_AL;
  int iVar2;
  char *__s;
  char *__s_00;
  SUNErrHandler_conflict pSVar3;
  size_t sVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = local_e8;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].gp_offset = 0x30;
  ap[0].fp_offset = 0x30;
  if (msgfmt == (char *)0x0) {
    sVar4 = 1;
  }
  else {
    iVar2 = vsnprintf((char *)0x0,0,msgfmt,ap);
    sVar4 = (long)iVar2 + 1;
  }
  __s = (char *)malloc(sVar4);
  ap[0].gp_offset = 0x30;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_e8;
  vsnprintf(__s,sVar4,msgfmt,ap);
  if (IDA_mem == (IDAMem)0x0) {
    SUNGlobalFallbackErrHandler(line,func,file,__s,error_code);
  }
  else if (error_code == 99) {
    sVar4 = strlen(file);
    __s_00 = (char *)malloc(sVar4 + 6);
    snprintf(__s_00,sVar4 + 6,"%s:%d",file,(ulong)(uint)line);
    SUNLogger_QueueMsg(IDA_mem->ida_sunctx->logger,2,__s_00,func,__s);
    free(__s_00);
  }
  else {
    pSVar1 = IDA_mem->ida_sunctx;
    if (pSVar1 == (SUNContext)0x0) {
      SUNGlobalFallbackErrHandler(line,func,file,__s,error_code);
    }
    pSVar1->last_err = error_code;
    pSVar3 = (SUNErrHandler_conflict)&pSVar1->err_handler;
    while (pSVar3 = pSVar3->previous, pSVar3 != (SUNErrHandler_conflict)0x0) {
      (*pSVar3->call)(line,func,file,__s,error_code,pSVar3->data,pSVar1);
    }
    SUNContext_GetLastError(IDA_mem->ida_sunctx);
  }
  free(__s);
  return;
}

Assistant:

void IDAProcessError(IDAMem IDA_mem, int error_code, int line, const char* func,
                     const char* file, const char* msgfmt, ...)
{
  /* We initialize the argument pointer variable before each vsnprintf call to avoid undefined behavior
     (msgfmt is the last required argument to IDAProcessError) */
  va_list ap;

  /* Compose the message */
  va_start(ap, msgfmt);
  size_t msglen = 1;
  if (msgfmt) { msglen += vsnprintf(NULL, 0, msgfmt, ap); }
  va_end(ap);

  char* msg = (char*)malloc(msglen);

  va_start(ap, msgfmt);
  vsnprintf(msg, msglen, msgfmt, ap);
  va_end(ap);

  do {
    if (IDA_mem == NULL)
    {
      SUNGlobalFallbackErrHandler(line, func, file, msg, error_code);
      break;
    }

    if (error_code == IDA_WARNING)
    {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_WARNING
      char* file_and_line = sunCombineFileAndLine(line, file);
      SUNLogger_QueueMsg(IDA_LOGGER, SUN_LOGLEVEL_WARNING, file_and_line, func,
                         msg);
      free(file_and_line);
#endif
      break;
    }

    /* Call the SUNDIALS main error handler */
    SUNHandleErrWithMsg(line, func, file, msg, error_code, IDA_mem->ida_sunctx);

    /* Clear the last error value */
    (void)SUNContext_GetLastError(IDA_mem->ida_sunctx);
  }
  while (0);

  free(msg);

  return;
}